

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O0

void __thiscall Am_Inter_Location_Data::Print(Am_Inter_Location_Data *this,ostream *os)

{
  ostream *poVar1;
  ostream *os_local;
  Am_Inter_Location_Data *this_local;
  
  std::operator<<(os,"(");
  if ((this->as_line & 1U) == 0) {
    if ((this->growing & 1U) == 0) {
      poVar1 = (ostream *)std::ostream::operator<<(os,(this->data).rect.left);
      poVar1 = std::operator<<(poVar1,",");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->data).rect.top);
      std::operator<<(poVar1,")");
    }
    else {
      poVar1 = (ostream *)std::ostream::operator<<(os,(this->data).rect.left);
      poVar1 = std::operator<<(poVar1,",");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->data).rect.top);
      poVar1 = std::operator<<(poVar1,",");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->data).rect.width);
      poVar1 = std::operator<<(poVar1,",");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->data).rect.height);
      std::operator<<(poVar1,")");
    }
  }
  else {
    poVar1 = (ostream *)std::ostream::operator<<(os,(this->data).rect.left);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->data).rect.top);
    poVar1 = std::operator<<(poVar1,").(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->data).rect.width);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->data).rect.height);
    std::operator<<(poVar1,")");
  }
  poVar1 = std::operator<<(os," w.r.t. ");
  ::operator<<(poVar1,&this->ref_obj);
  return;
}

Assistant:

void
Am_Inter_Location_Data::Print(std::ostream &os) const
{
  os << "(";
  if (as_line) {
    os << data.line.x1 << "," << data.line.y1 << ").(" << data.line.x2 << ","
       << data.line.y2 << ")";
  } else if (growing)
    os << data.rect.left << "," << data.rect.top << "," << data.rect.width
       << "," << data.rect.height << ")";
  else
    os << data.rect.left << "," << data.rect.top << ")";
  os << " w.r.t. " << ref_obj;
}